

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.h
# Opt level: O0

unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
__thiscall wabt::WastLexer::MakeLineFinder(WastLexer *this)

{
  unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *in_RSI;
  WastLexer *this_local;
  
  this_local = this;
  std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::operator->(in_RSI);
  LexerSource::Clone((LexerSource *)&stack0xffffffffffffffe0);
  std::
  make_unique<wabt::LexerSourceLineFinder,std::unique_ptr<wabt::LexerSource,std::default_delete<wabt::LexerSource>>>
            (&this->source_);
  std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::~unique_ptr
            ((unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *)
             &stack0xffffffffffffffe0);
  return (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
          )(__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<LexerSourceLineFinder> MakeLineFinder() {
    return std::make_unique<LexerSourceLineFinder>(source_->Clone());
  }